

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id,
          TIntermTyped *node)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  char *pcVar5;
  pointer pcVar6;
  char *pcVar7;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  undefined8 uVar8;
  undefined1 uVar9;
  uint uVar10;
  ulong uVar11;
  size_type sVar12;
  
  integerCheck(this,node,"layout-id value");
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])(node);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)**(uint **)(*(long *)(CONCAT44(extraout_var,iVar3) + 0xc0) + 8);
  }
  pcVar6 = (id->_M_dataplus)._M_p;
  sVar1 = id->_M_string_length;
  for (sVar12 = 0; sVar1 != sVar12; sVar12 = sVar12 + 1) {
    iVar3 = tolower((int)pcVar6[sVar12]);
    pcVar6[sVar12] = (char)iVar3;
  }
  bVar2 = std::operator==(id,"offset");
  uVar10 = (uint)uVar11;
  if (bVar2) {
    qualifier->layoutOffset = uVar10;
    return;
  }
  bVar2 = std::operator==(id,"align");
  if (bVar2) {
    if ((0 < (int)uVar10) && ((uVar10 + 0x7fffffff & uVar10) == 0)) {
      qualifier->layoutAlign = uVar10;
      return;
    }
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar7 = "must be a power of 2";
    pcVar5 = "align";
    goto LAB_003997d3;
  }
  bVar2 = std::operator==(id,"location");
  if (bVar2) {
    if (uVar10 < 0xfff) {
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | uVar11;
      return;
    }
    pcVar5 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar7 = "location is too large";
    goto LAB_003997d3;
  }
  bVar2 = std::operator==(id,"set");
  if (bVar2) {
    if (0x3e < uVar10) {
      pcVar5 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "set is too large";
      goto LAB_003997d3;
    }
    uVar11 = (ulong)(uVar10 << 0xf);
    uVar4 = 0xffffffffffc07fff;
LAB_00399963:
    *(ulong *)&qualifier->field_0x1c = uVar4 & *(ulong *)&qualifier->field_0x1c | uVar11;
    return;
  }
  bVar2 = std::operator==(id,"binding");
  if (bVar2) {
    if (0xfffe < uVar10) {
      pcVar5 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "binding is too large";
      goto LAB_003997d3;
    }
    uVar11 = uVar11 << 0x20;
    uVar4 = 0xffff0000ffffffff;
    goto LAB_00399963;
  }
  bVar2 = std::operator==(id,"component");
  if (bVar2) {
    if (3 < uVar10) {
      pcVar5 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "component is too large";
      goto LAB_003997d3;
    }
    uVar11 = (ulong)(uVar10 << 0xc);
    uVar4 = 0xffffffffffff8fff;
    goto LAB_00399963;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,0,4,"xfb_");
  if (iVar3 == 0) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbMode = true;
    bVar2 = std::operator==(id,"xfb_buffer");
    if (bVar2) {
      if ((this->super_TParseContextBase).resources.maxTransformFeedbackBuffers <= (int)uVar10) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"buffer is too large:",(id->_M_dataplus)._M_p,
                   "gl_MaxTransformFeedbackBuffers is %d");
      }
      if (0xe < (int)uVar10) {
        pcVar6 = (id->_M_dataplus)._M_p;
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar5 = "buffer is too large:";
        uVar8 = 0xe;
LAB_00399a9b:
        (*UNRECOVERED_JUMPTABLE_00)(this,loc,pcVar5,pcVar6,"internal max is %d",uVar8);
        return;
      }
      uVar10 = uVar10 & 0xf;
      uVar11 = *(ulong *)&qualifier->field_0x24 & 0xfffffffffffffff0;
      goto LAB_00399c86;
    }
    bVar2 = std::operator==(id,"xfb_offset");
    if (bVar2) {
      if (0x1ffe < (int)uVar10) {
        pcVar6 = (id->_M_dataplus)._M_p;
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar5 = "offset is too large:";
        uVar8 = 0x1ffe;
        goto LAB_00399a9b;
      }
      uVar10 = (uVar10 & 0x1fff) << 0x12;
      uVar11 = 0xffffffff8003ffff;
    }
    else {
      bVar2 = std::operator==(id,"xfb_stride");
      if (!bVar2) goto LAB_003998ed;
      if ((this->super_TParseContextBase).resources.maxTransformFeedbackInterleavedComponents * 4 <
          (int)uVar10) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"1/4 stride is too large:",(id->_M_dataplus)._M_p,
                   "gl_MaxTransformFeedbackInterleavedComponents is %d");
        if (0x3ffe < (int)uVar10) {
          return;
        }
      }
      else if (0x3ffe < (int)uVar10) {
        pcVar6 = (id->_M_dataplus)._M_p;
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar5 = "stride is too large:";
        uVar8 = 0x3ffe;
        goto LAB_00399a9b;
      }
      uVar10 = (uVar10 & 0x3fff) << 4;
      uVar11 = 0xfffffffffffc000f;
    }
    uVar11 = uVar11 & *(ulong *)&qualifier->field_0x24;
LAB_00399c86:
    *(ulong *)&qualifier->field_0x24 = uVar11 | uVar10;
    return;
  }
LAB_003998ed:
  bVar2 = std::operator==(id,"input_attachment_index");
  uVar9 = (undefined1)uVar11;
  if (bVar2) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"input_attachment_index");
    if ((int)uVar10 < 0xff) {
      qualifier->field_0x28 = uVar9;
      return;
    }
    pcVar5 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar7 = "attachment index is too large";
    goto LAB_003997d3;
  }
  bVar2 = std::operator==(id,"constant_id");
  if (bVar2) {
    setSpecConstantId(this,loc,qualifier,uVar10);
    return;
  }
  switch((this->super_TParseContextBase).super_TParseVersions.language) {
  case EShLangTessControl:
    bVar2 = std::operator==(id,"vertices");
    if (bVar2) {
      if (uVar10 == 0) {
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar7 = "must be greater than 0";
        pcVar5 = "vertices";
        goto LAB_003997d3;
      }
LAB_00399b00:
      pcVar5 = (id->_M_dataplus)._M_p;
LAB_00399d80:
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
      pcVar7 = "ignored";
      goto LAB_003997d3;
    }
    break;
  case EShLangGeometry:
    bVar2 = std::operator==(id,"invocations");
    if (bVar2) {
      if (uVar10 == 0) {
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar7 = "must be at least 1";
        pcVar5 = "invocations";
        goto LAB_003997d3;
      }
      goto LAB_00399d77;
    }
    bVar2 = std::operator==(id,"max_vertices");
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,"ignored",(id->_M_dataplus)._M_p,"");
      if ((int)uVar10 <= (this->super_TParseContextBase).resources.maxGeometryOutputVertices) {
        return;
      }
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "too large, must be less than gl_MaxGeometryOutputVertices";
      pcVar5 = "max_vertices";
      goto LAB_003997d3;
    }
    bVar2 = std::operator==(id,"stream");
    if (bVar2) {
      qualifier->field_0x23 = uVar9;
      return;
    }
    break;
  case EShLangFragment:
    bVar2 = std::operator==(id,"index");
    if (bVar2) {
      qualifier->field_0x22 = uVar9;
      return;
    }
    break;
  case EShLangCompute:
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,0,0xb,"local_size_");
    if (iVar3 == 0) {
      bVar2 = std::operator==(id,"local_size_x");
      if (((bVar2) || (bVar2 = std::operator==(id,"local_size_y"), bVar2)) ||
         (bVar2 = std::operator==(id,"local_size_z"), bVar2)) {
LAB_00399d77:
        pcVar5 = (id->_M_dataplus)._M_p;
        goto LAB_00399d80;
      }
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
        bVar2 = std::operator==(id,"local_size_x_id");
        if ((bVar2) || (bVar2 = std::operator==(id,"local_size_y_id"), bVar2)) goto LAB_00399d77;
        bVar2 = std::operator==(id,"local_size_z_id");
        if (bVar2) goto LAB_00399b00;
      }
    }
  }
  pcVar5 = (id->_M_dataplus)._M_p;
  UNRECOVERED_JUMPTABLE_00 =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar7 = "there is no such layout identifier for this stage taking an assigned value";
LAB_003997d3:
  (*UNRECOVERED_JUMPTABLE_00)(this,loc,pcVar7,pcVar5,"",UNRECOVERED_JUMPTABLE_00);
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id,
                                          const TIntermTyped* node)
{
    const char* feature = "layout-id value";
    // const char* nonLiteralFeature = "non-literal layout-id value";

    integerCheck(node, feature);
    const TIntermConstantUnion* constUnion = node->getAsConstantUnion();
    int value = 0;
    if (constUnion) {
        value = constUnion->getConstArray()[0].getIConst();
    }

    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == "offset") {
        qualifier.layoutOffset = value;
        return;
    } else if (id == "align") {
        // "The specified alignment must be a power of 2, or a compile-time error results."
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "align", "");
        else
            qualifier.layoutAlign = value;
        return;
    } else if (id == "location") {
        if ((unsigned int)value >= TQualifier::layoutLocationEnd)
            error(loc, "location is too large", id.c_str(), "");
        else
            qualifier.layoutLocation = value;
        return;
    } else if (id == "set") {
        if ((unsigned int)value >= TQualifier::layoutSetEnd)
            error(loc, "set is too large", id.c_str(), "");
        else
            qualifier.layoutSet = value;
        return;
    } else if (id == "binding") {
        if ((unsigned int)value >= TQualifier::layoutBindingEnd)
            error(loc, "binding is too large", id.c_str(), "");
        else
            qualifier.layoutBinding = value;
        return;
    } else if (id == "component") {
        if ((unsigned)value >= TQualifier::layoutComponentEnd)
            error(loc, "component is too large", id.c_str(), "");
        else
            qualifier.layoutComponent = value;
        return;
    } else if (id.compare(0, 4, "xfb_") == 0) {
        // "Any shader making any static use (after preprocessing) of any of these
        // *xfb_* qualifiers will cause the shader to be in a transform feedback
        // capturing mode and hence responsible for describing the transform feedback
        // setup."
        intermediate.setXfbMode();
        if (id == "xfb_buffer") {
            // "It is a compile-time error to specify an *xfb_buffer* that is greater than
            // the implementation-dependent constant gl_MaxTransformFeedbackBuffers."
            if (value >= resources.maxTransformFeedbackBuffers)
                error(loc, "buffer is too large:", id.c_str(), "gl_MaxTransformFeedbackBuffers is %d",
                      resources.maxTransformFeedbackBuffers);
            if (value >= (int)TQualifier::layoutXfbBufferEnd)
                error(loc, "buffer is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbBufferEnd - 1);
            else
                qualifier.layoutXfbBuffer = value;
            return;
        } else if (id == "xfb_offset") {
            if (value >= (int)TQualifier::layoutXfbOffsetEnd)
                error(loc, "offset is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbOffsetEnd - 1);
            else
                qualifier.layoutXfbOffset = value;
            return;
        } else if (id == "xfb_stride") {
            // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
            // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
            if (value > 4 * resources.maxTransformFeedbackInterleavedComponents)
                error(loc, "1/4 stride is too large:", id.c_str(), "gl_MaxTransformFeedbackInterleavedComponents is %d",
                      resources.maxTransformFeedbackInterleavedComponents);
            else if (value >= (int)TQualifier::layoutXfbStrideEnd)
                error(loc, "stride is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbStrideEnd - 1);
            if (value < (int)TQualifier::layoutXfbStrideEnd)
                qualifier.layoutXfbStride = value;
            return;
        }
    }

    if (id == "input_attachment_index") {
        requireVulkan(loc, "input_attachment_index");
        if (value >= (int)TQualifier::layoutAttachmentEnd)
            error(loc, "attachment index is too large", id.c_str(), "");
        else
            qualifier.layoutAttachment = value;
        return;
    }
    if (id == "constant_id") {
        setSpecConstantId(loc, qualifier, value);
        return;
    }

    switch (language) {
    case EShLangVertex:
        break;

    case EShLangTessControl:
        if (id == "vertices") {
            if (value == 0)
                error(loc, "must be greater than 0", "vertices", "");
            else
                // publicType.shaderQualifiers.vertices = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        break;

    case EShLangTessEvaluation:
        break;

    case EShLangGeometry:
        if (id == "invocations") {
            if (value == 0)
                error(loc, "must be at least 1", "invocations", "");
            else
                // publicType.shaderQualifiers.invocations = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "max_vertices") {
            // publicType.shaderQualifiers.vertices = value;
            warn(loc, "ignored", id.c_str(), "");
            if (value > resources.maxGeometryOutputVertices)
                error(loc, "too large, must be less than gl_MaxGeometryOutputVertices", "max_vertices", "");
            return;
        }
        if (id == "stream") {
            qualifier.layoutStream = value;
            return;
        }
        break;

    case EShLangFragment:
        if (id == "index") {
            qualifier.layoutIndex = value;
            return;
        }
        break;

    case EShLangCompute:
        if (id.compare(0, 11, "local_size_") == 0) {
            if (id == "local_size_x") {
                // publicType.shaderQualifiers.localSize[0] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_y") {
                // publicType.shaderQualifiers.localSize[1] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_z") {
                // publicType.shaderQualifiers.localSize[2] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (spvVersion.spv != 0) {
                if (id == "local_size_x_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[0] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_y_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[1] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_z_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[2] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
            }
        }
        break;

    default:
        break;
    }

    error(loc, "there is no such layout identifier for this stage taking an assigned value", id.c_str(), "");
}